

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O1

void __thiscall Timer::Timer(Timer *this)

{
  (this->tm_queue).c.super__Vector_base<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tm_queue).c.super__Vector_base<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tm_queue).c.super__Vector_base<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tm_running)._M_base._M_i = false;
  (this->tm_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->tm_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->tm_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->tm_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (this->tm_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  std::condition_variable::condition_variable(&this->tm_cond);
  *(_Elt_pointer *)
   ((long)&(this->tm_thread_pool).tp_tasks.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->tm_thread_pool).tp_tasks.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  (this->tm_thread_pool).tp_tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->tm_thread_pool).tp_tasks.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->tm_thread_pool).tp_tasks.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->tm_thread_pool).tp_tasks.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->tm_thread_pool).tp_tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->tm_thread_pool).tp_tasks.c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  (this->tm_thread_pool).tp_tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->tm_thread_pool).tp_tasks.c.
  super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->tm_thread_pool).tp_pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tm_thread_pool).tp_pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tm_tick_thread)._M_id._M_thread = 0;
  (this->tm_thread_pool).tp_pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map((_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *
                    )&(this->tm_thread_pool).tp_tasks,0);
  *(undefined8 *)((long)&(this->tm_thread_pool).tp_lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->tm_thread_pool).tp_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->tm_thread_pool).tp_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->tm_thread_pool).tp_lock.super___mutex_base._M_mutex + 8) = 0;
  (this->tm_thread_pool).tp_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->tm_thread_pool).tp_task_cv);
  (this->tm_thread_pool).tp_run._M_base._M_i = true;
  (this->tm_thread_pool).tp_idl_tnum.super___atomic_base<int>._M_i = 0;
  Threadpool::add_thread(&this->tm_thread_pool,2);
  (this->tm_id).super___atomic_base<int>._M_i = 0;
  (this->tm_id_state_map).hm_map._M_h._M_buckets =
       &(this->tm_id_state_map).hm_map._M_h._M_single_bucket;
  (this->tm_id_state_map).hm_map._M_h._M_bucket_count = 1;
  (this->tm_id_state_map).hm_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tm_id_state_map).hm_map._M_h._M_element_count = 0;
  (this->tm_id_state_map).hm_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tm_id_state_map).hm_map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tm_id_state_map).hm_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tm_id_state_map).hm_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->tm_id_state_map).hm_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->tm_id_state_map).hm_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->tm_id_state_map).hm_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->tm_id_state_map).hm_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  LOCK();
  (this->tm_id).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->tm_running)._M_base._M_i = true;
  UNLOCK();
  return;
}

Assistant:

Timer() : tm_thread_pool(DEFAULT_TIMER_THREAD_POOL_SIZE) {
// cout <<"create timer" <<endl;
        tm_id.store(0);
        tm_running.store(true);
    }